

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

NodeSourceInfoBuilderPair * __thiscall
capnp::compiler::NodeTranslator::StructTranslator::newGroupNode
          (NodeSourceInfoBuilderPair *__return_storage_ptr__,StructTranslator *this,Reader parent,
          Reader decl)

{
  RemoveConst<capnp::compiler::NodeTranslator::AuxNode> **ppRVar1;
  NodeTranslator *pNVar2;
  AuxNode *pAVar3;
  AuxNode *pAVar4;
  RemoveConst<capnp::compiler::NodeTranslator::AuxNode> *pRVar5;
  undefined8 uVar6;
  SegmentBuilder *pSVar7;
  byte bVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  SegmentReader *pSVar12;
  size_t newSize;
  ArrayPtr<const_char> *in_R8;
  Reader RVar13;
  Reader RVar14;
  BuilderFor<capnp::schema::Node> node;
  BuilderFor<capnp::schema::Node::SourceInfo> sourceInfo;
  undefined1 local_129 [9];
  SegmentBuilder *pSStack_120;
  WirePointer *local_118;
  int local_110;
  OrphanBuilder local_100;
  OrphanBuilder local_e0;
  StructReader local_c0;
  StructBuilder local_90;
  StructBuilder local_68;
  char *local_40;
  long local_38;
  
  capnp::_::OrphanBuilder::initStruct
            ((OrphanBuilder *)&local_c0,(this->translator->orphanage).arena,
             (this->translator->orphanage).capTable,(StructSize)0x60006);
  local_100.location = (word *)CONCAT44(local_c0.pointers._4_4_,(int)local_c0.pointers);
  local_100.capTable = (CapTableBuilder *)local_c0.data;
  local_100.tag.content = (uint64_t)local_c0.segment;
  local_100.segment = (SegmentBuilder *)local_c0.capTable;
  capnp::_::OrphanBuilder::initStruct
            ((OrphanBuilder *)&local_c0,(this->translator->orphanage).arena,
             (this->translator->orphanage).capTable,(StructSize)0x20002);
  local_e0.location = (word *)CONCAT44(local_c0.pointers._4_4_,(int)local_c0.pointers);
  local_e0.capTable = (CapTableBuilder *)local_c0.data;
  local_e0.tag.content = (uint64_t)local_c0.segment;
  local_e0.segment = (SegmentBuilder *)local_c0.capTable;
  capnp::_::OrphanBuilder::asStruct(&local_90,&local_100,(StructSize)0x60006);
  capnp::_::OrphanBuilder::asStruct(&local_68,&local_e0,(StructSize)0x20002);
  if (decl._reader.pointerCount == 0) {
    decl._reader.nestingLimit = 0x7fffffff;
    decl._reader.capTable = (CapTableReader *)0x0;
    decl._reader.pointers = (WirePointer *)0x0;
    decl._reader.segment = (SegmentReader *)0x0;
  }
  local_129._1_8_ = decl._reader.segment;
  pSStack_120 = (SegmentBuilder *)decl._reader.capTable;
  local_118 = decl._reader.pointers;
  local_110 = decl._reader.nestingLimit;
  capnp::_::PointerReader::getStruct(&local_c0,(PointerReader *)((long)local_129 + 1),(word *)0x0);
  if (local_c0.pointerCount == 0) {
    local_c0.nestingLimit = 0x7fffffff;
    local_c0.capTable = (CapTableReader *)0x0;
    local_118 = (WirePointer *)0x0;
    local_c0.segment = (SegmentReader *)0x0;
  }
  else {
    local_118 = (WirePointer *)CONCAT44(local_c0.pointers._4_4_,(int)local_c0.pointers);
  }
  local_129._1_8_ = local_c0.segment;
  pSStack_120 = (SegmentBuilder *)local_c0.capTable;
  local_110 = local_c0.nestingLimit;
  RVar13 = capnp::_::PointerReader::getBlob<capnp::Text>
                     ((PointerReader *)((long)local_129 + 1),(void *)0x0,0);
  local_40 = RVar13.super_StringPtr.content.ptr;
  if (parent._reader.pointerCount == 0) {
    parent._reader.nestingLimit = 0x7fffffff;
    parent._reader.capTable = (CapTableReader *)0x0;
    parent._reader.pointers = (WirePointer *)0x0;
    parent._reader.segment = (SegmentReader *)0x0;
  }
  local_c0.segment = parent._reader.segment;
  local_c0.capTable = parent._reader.capTable;
  local_c0.data = parent._reader.pointers;
  local_c0.pointers._0_4_ = parent._reader.nestingLimit;
  RVar14 = capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_c0,(void *)0x0,0);
  local_c0.segment = RVar14.super_StringPtr.content.ptr;
  local_c0.capTable = (CapTableReader *)(RVar14.super_StringPtr.content.size_ - 1);
  local_129[0] = 0x2e;
  local_38 = RVar13.super_StringPtr.content.size_ - 1;
  kj::_::concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>>
            ((String *)((long)local_129 + 1),(_ *)&local_c0,(ArrayPtr<const_char> *)local_129,
             (FixedArray<char,_1UL> *)&local_40,in_R8);
  pSVar12 = (SegmentReader *)local_129._1_8_;
  if (pSStack_120 == (SegmentBuilder *)0x0) {
    pSVar12 = (SegmentReader *)0x1e253d;
  }
  RVar14.super_StringPtr.content.size_ =
       (long)&(pSStack_120->super_SegmentReader).arena +
       (ulong)(pSStack_120 == (SegmentBuilder *)0x0);
  local_c0.segment = &(local_90.segment)->super_SegmentReader;
  local_c0.capTable = &(local_90.capTable)->super_CapTableReader;
  local_c0.data = local_90.pointers;
  RVar14.super_StringPtr.content.ptr = (char *)pSVar12;
  capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_c0,RVar14);
  pSVar7 = pSStack_120;
  uVar6 = local_129._1_8_;
  if ((SegmentReader *)local_129._1_8_ != (SegmentReader *)0x0) {
    local_129._1_8_ = (SegmentReader *)0x0;
    pSStack_120 = (SegmentBuilder *)0x0;
    (**(code **)*local_118)(local_118,uVar6,1,pSVar7,pSVar7,0);
  }
  local_c0.segment = &(local_90.segment)->super_SegmentReader;
  local_c0.capTable = &(local_90.capTable)->super_CapTableReader;
  local_c0.data = local_90.pointers;
  capnp::_::PointerBuilder::getBlob<capnp::Text>
            ((Builder *)((long)local_129 + 1),(PointerBuilder *)&local_c0,(void *)0x0,0);
  *(int *)((long)local_90.data + 8) = (int)local_118 - (int)RVar13.super_StringPtr.content.size_;
  bVar8 = 0;
  if (0x120 < parent._reader.dataSize) {
    bVar8 = *(byte *)((long)parent._reader.data + 0x24) & 1;
  }
  *(byte *)((long)local_90.data + 0x24) = *(byte *)((long)local_90.data + 0x24) & 0xfe | bVar8;
  *(undefined4 *)((long)local_90.data + 0xc) = 1;
  *(undefined4 *)((long)local_90.data + 0x18) = 0;
  *(byte *)((long)local_90.data + 0x1c) = *(byte *)((long)local_90.data + 0x1c) & 0xfe;
  *(undefined2 *)((long)local_90.data + 0x1e) = 0;
  *(undefined4 *)((long)local_90.data + 0x20) = 0;
  local_c0.data = local_90.pointers + 3;
  local_c0.segment = &(local_90.segment)->super_SegmentReader;
  local_c0.capTable = &(local_90.capTable)->super_CapTableReader;
  capnp::_::PointerBuilder::clear((PointerBuilder *)&local_c0);
  *(byte *)((long)local_90.data + 0x1c) = *(byte *)((long)local_90.data + 0x1c) | 1;
  uVar10 = 0;
  uVar11 = 0;
  if (0x3f < decl._reader.dataSize) {
    uVar11 = *(undefined4 *)((long)decl._reader.data + 4);
  }
  *(undefined4 *)((long)local_90.data + 0x28) = uVar11;
  if (0x5f < decl._reader.dataSize) {
    uVar10 = *(undefined4 *)((long)decl._reader.data + 8);
  }
  uVar9 = 0;
  *(undefined4 *)((long)local_90.data + 0x2c) = uVar10;
  uVar11 = 0;
  if (0x3f < decl._reader.dataSize) {
    uVar11 = *(undefined4 *)((long)decl._reader.data + 4);
  }
  *(undefined4 *)((long)local_68.data + 8) = uVar11;
  if (0x5f < decl._reader.dataSize) {
    uVar9 = *(undefined4 *)((long)decl._reader.data + 8);
  }
  *(undefined4 *)((long)local_68.data + 0xc) = uVar9;
  pNVar2 = this->translator;
  pAVar3 = (pNVar2->groups).builder.endPtr;
  if ((pNVar2->groups).builder.pos == pAVar3) {
    pAVar4 = (pNVar2->groups).builder.ptr;
    newSize = 4;
    if (pAVar3 != pAVar4) {
      newSize = (long)pAVar3 - (long)pAVar4 >> 5;
    }
    kj::Vector<capnp::compiler::NodeTranslator::AuxNode>::setCapacity(&pNVar2->groups,newSize);
  }
  pRVar5 = (pNVar2->groups).builder.pos;
  (pRVar5->node).builder.segment = local_100.segment;
  (pRVar5->node).builder.capTable = local_100.capTable;
  (pRVar5->node).builder.location = local_100.location;
  (pRVar5->node).builder.tag.content = local_100.tag.content;
  (pRVar5->sourceInfo).builder.segment = local_e0.segment;
  (pRVar5->sourceInfo).builder.capTable = local_e0.capTable;
  (pRVar5->sourceInfo).builder.location = local_e0.location;
  (pRVar5->sourceInfo).builder.tag.content = local_e0.tag.content;
  ppRVar1 = &(pNVar2->groups).builder.pos;
  *ppRVar1 = *ppRVar1 + 1;
  (__return_storage_ptr__->node)._builder.dataSize = local_90.dataSize;
  (__return_storage_ptr__->node)._builder.pointerCount = local_90.pointerCount;
  *(undefined2 *)&(__return_storage_ptr__->node)._builder.field_0x26 = local_90._38_2_;
  (__return_storage_ptr__->node)._builder.data = local_90.data;
  (__return_storage_ptr__->node)._builder.pointers = local_90.pointers;
  (__return_storage_ptr__->node)._builder.segment = local_90.segment;
  (__return_storage_ptr__->node)._builder.capTable = local_90.capTable;
  (__return_storage_ptr__->sourceInfo)._builder.dataSize = local_68.dataSize;
  (__return_storage_ptr__->sourceInfo)._builder.pointerCount = local_68.pointerCount;
  *(undefined2 *)&(__return_storage_ptr__->sourceInfo)._builder.field_0x26 = local_68._38_2_;
  (__return_storage_ptr__->sourceInfo)._builder.data = local_68.data;
  (__return_storage_ptr__->sourceInfo)._builder.pointers = local_68.pointers;
  (__return_storage_ptr__->sourceInfo)._builder.segment = local_68.segment;
  (__return_storage_ptr__->sourceInfo)._builder.capTable = local_68.capTable;
  return __return_storage_ptr__;
}

Assistant:

NodeSourceInfoBuilderPair newGroupNode(schema::Node::Reader parent, Declaration::Reader decl) {
    AuxNode aux {
      translator.orphanage.newOrphan<schema::Node>(),
      translator.orphanage.newOrphan<schema::Node::SourceInfo>()
    };
    auto node = aux.node.get();
    auto sourceInfo = aux.sourceInfo.get();
    auto name = decl.getName().getValue();

    // We'll set the ID and scope ID later.
    node.setDisplayName(kj::str(parent.getDisplayName(), '.', name));
    node.setDisplayNamePrefixLength(node.getDisplayName().size() - name.size());
    node.setIsGeneric(parent.getIsGeneric());
    node.initStruct().setIsGroup(true);
    node.setStartByte(decl.getStartByte());
    node.setEndByte(decl.getEndByte());

    sourceInfo.setStartByte(decl.getStartByte());
    sourceInfo.setEndByte(decl.getEndByte());

    // The remaining contents of node.struct will be filled in later.

    translator.groups.add(kj::mv(aux));
    return { node, sourceInfo };
  }